

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smfdur.cpp
# Opt level: O0

string * minutes_abi_cxx11_(double seconds)

{
  int iVar1;
  string *in_RDI;
  double dVar2;
  __cxx11 local_a0 [36];
  int local_7c;
  __cxx11 local_78 [4];
  int isec;
  __cxx11 local_48 [39];
  undefined1 local_21;
  int local_20;
  int local_1c;
  int hours;
  int minutes;
  double seconds_local;
  string *output;
  
  local_1c = (int)(seconds / 60.0);
  dVar2 = seconds - (double)(local_1c * 0x3c);
  if (dVar2 - (double)(int)dVar2 < 0.5) {
    iVar1 = (int)dVar2;
  }
  else {
    iVar1 = (int)dVar2 + 1;
  }
  _hours = (double)iVar1;
  if ((_hours == 60.0) && (!NAN(_hours))) {
    local_1c = local_1c + 1;
    _hours = 0.0;
  }
  local_20 = local_1c / 0x3c;
  if (0 < local_20) {
    local_1c = local_1c % 0x3c;
  }
  local_21 = 0;
  std::__cxx11::string::string(in_RDI);
  if (local_20 != 0) {
    std::__cxx11::to_string(local_48,local_20);
    std::__cxx11::string::operator+=(in_RDI,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
    std::__cxx11::string::operator+=(in_RDI,":");
    if (local_1c < 10) {
      std::__cxx11::string::operator+=(in_RDI,"0");
    }
  }
  std::__cxx11::to_string(local_78,local_1c);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::operator+=(in_RDI,":");
  if (_hours < 10.0) {
    std::__cxx11::string::operator+=(in_RDI,"0");
  }
  local_7c = (int)_hours;
  std::__cxx11::to_string(local_a0,local_7c);
  std::__cxx11::string::operator+=(in_RDI,(string *)local_a0);
  std::__cxx11::string::~string((string *)local_a0);
  return in_RDI;
}

Assistant:

string minutes(double seconds) {
	int minutes = seconds / 60;
	seconds = seconds - minutes * 60;
	if (seconds - int(seconds) >= 0.5) {
		seconds = int(seconds) + 1;
	} else{
		seconds = int(seconds);
	}
	if (seconds == 60) {
		minutes++;
		seconds = 0;
	}
	int hours = minutes / 60;
	if (hours >= 1) {
		minutes = minutes - hours * 60;
	}

	string output;
	if (hours) {
		output += to_string(hours);
		output += ":";
		if (minutes < 10) {
			output += "0";
		}
	}
	output += to_string(minutes);
	output += ":";
	if (seconds < 10) {
		output += "0";
	}
	int isec = seconds;
	output += to_string(isec);
	return output;
}